

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

bool __thiscall mat_lib::matrix<double>::operator==(matrix<double> *this,matrix<double> *m)

{
  double dVar1;
  size_t sVar2;
  size_t sVar3;
  element_t *peVar4;
  ulong local_30;
  size_t j;
  size_t i;
  matrix<double> *m_local;
  matrix<double> *this_local;
  
  sVar3 = this->rows__;
  sVar2 = rows(m);
  if ((sVar3 != sVar2) || (sVar3 = this->columns__, sVar2 = columns(m), sVar3 != sVar2)) {
    return false;
  }
  j = 0;
  do {
    if (this->rows__ <= j) {
      return true;
    }
    for (local_30 = 0; local_30 < this->columns__; local_30 = local_30 + 1) {
      peVar4 = this->elements__;
      sVar3 = offset__(this,j,(int)local_30);
      dVar1 = peVar4[sVar3];
      peVar4 = operator[](m,j);
      if ((dVar1 != peVar4[local_30]) || (NAN(dVar1) || NAN(peVar4[local_30]))) {
        return false;
      }
    }
    j = j + 1;
  } while( true );
}

Assistant:

bool matrix<T>::operator==(const matrix<T>& m) const
  {
    if((rows__!=m.rows()) || (columns__!=m.columns())) return false; 

    for(size_t i=0; i<rows__; i++)
      for(size_t j=0; j<columns__; j++) 
        if(elements__[offset__(i,j)]!=m[i][j]) return false;
    
    return true;
  }